

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenubar.cpp
# Opt level: O1

void __thiscall QMenuBarPrivate::calcActionRects(QMenuBarPrivate *this,int max_width,int start)

{
  QList<QRect> *this_00;
  int *piVar1;
  int iVar2;
  QWidget *this_01;
  QAction *pQVar3;
  QWidgetData *pQVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  LayoutDirection direction;
  QStyle *pQVar12;
  QStyle *pQVar13;
  undefined8 uVar14;
  pointer pQVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long in_FS_OFFSET;
  QRect QVar23;
  QIcon is;
  QSize sz;
  QFontMetrics fm;
  QStyleOptionMenuItem opt;
  int local_14c;
  int local_148;
  QIcon local_f0;
  undefined8 local_e8;
  undefined1 *local_e0;
  undefined1 local_d8 [8];
  undefined1 *puStack_d0;
  undefined1 *local_c8;
  QArrayData *local_78;
  QIcon local_60 [2];
  QFont local_50 [24];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->super_QWidgetPrivate).field_0x254 & 1) != 0) {
    this_01 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    this_00 = &this->actionRects;
    QList<QRect>::resize(this_00,(this->super_QWidgetPrivate).actions.d.size);
    local_d8 = (undefined1  [8])0x0;
    puStack_d0 = (undefined1 *)0xffffffffffffffff;
    QList<QRect>::fill(this_00,(parameter_type)local_d8,-1);
    pQVar12 = QWidget::style(this_01);
    iVar7 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x22,0,this_01);
    local_e0 = &DAT_aaaaaaaaaaaaaaaa;
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_e0,&this_01->data->fnt);
    iVar8 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x24,0,this_01);
    local_14c = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x23,0,this_01);
    iVar9 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x3e,0);
    if ((this->super_QWidgetPrivate).actions.d.size == 0) {
      iVar11 = 0;
      local_148 = -1;
      iVar2 = 0;
      iVar16 = 0;
    }
    else {
      local_148 = -1;
      lVar19 = 0xc;
      uVar22 = 0;
      iVar16 = 0;
      iVar2 = 0;
      iVar11 = 0;
      do {
        pQVar3 = (this->super_QWidgetPrivate).actions.d.ptr[uVar22];
        cVar6 = QAction::isVisible();
        if (cVar6 != '\0') {
          local_e8 = 0xffffffffffffffff;
          cVar6 = QAction::isSeparator();
          if (cVar6 == '\0') {
            local_c8 = &DAT_aaaaaaaaaaaaaaaa;
            local_d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
            QAction::text();
            local_f0.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
            QAction::icon();
            cVar6 = QIcon::isNull();
            if (cVar6 == '\0') {
              iVar10 = (int)local_e8;
              if ((int)local_e8 <= iVar9) {
                iVar10 = iVar9;
              }
              if (local_e8._4_4_ <= iVar9) {
                local_e8._4_4_ = iVar9;
              }
              local_e8 = CONCAT44(local_e8._4_4_,iVar10);
            }
            else if (local_c8 != (undefined1 *)0x0) {
              local_e8 = QFontMetrics::size((int)&local_e0,(QString *)0x800,(int)local_d8,(int *)0x0
                                           );
            }
            QIcon::~QIcon(&local_f0);
            if (local_d8 != (undefined1  [8])0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_d8)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_d8)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_d8)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_d8,2,0x10);
              }
            }
            memset((QStyleOptionMenuItem *)local_d8,0xaa,0x98);
            QStyleOptionMenuItem::QStyleOptionMenuItem((QStyleOptionMenuItem *)local_d8);
            (**(code **)(*(long *)this_01 + 0x1a0))(this_01,(QStyleOptionMenuItem *)local_d8,pQVar3)
            ;
            pQVar13 = QWidget::style(this_01);
            uVar14 = (**(code **)(*(long *)pQVar13 + 0xe8))
                               (pQVar13,8,(QStyleOptionMenuItem *)local_d8,&local_e8,this_01);
            iVar10 = (int)uVar14;
            local_e8._4_4_ = (int)((ulong)uVar14 >> 0x20);
            if (0 < local_e8._4_4_ && 0 < iVar10) {
              iVar18 = iVar7 + iVar10;
              iVar17 = 0;
              if (local_148 == -1) {
                iVar17 = iVar18;
                iVar18 = 0;
              }
              iVar2 = iVar2 + iVar18;
              iVar16 = iVar16 + iVar17;
              if (iVar11 <= local_e8._4_4_) {
                iVar11 = local_e8._4_4_;
              }
              iVar17 = local_e8._4_4_ + -1;
              local_e8 = uVar14;
              pQVar15 = QList<QRect>::data(this_00);
              *(undefined8 *)((long)pQVar15 + lVar19 + -0xc) = 0;
              *(int *)((long)pQVar15 + lVar19 + -4) = iVar10 + -1;
              *(int *)((long)&(pQVar15->x1).m_i + lVar19) = iVar17;
              uVar14 = local_e8;
            }
            local_e8 = uVar14;
            QFont::~QFont(local_50);
            QIcon::~QIcon(local_60);
            if (local_78 != (QArrayData *)0x0) {
              LOCK();
              (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_78,2,0x10);
              }
            }
            QStyleOption::~QStyleOption((QStyleOption *)local_d8);
          }
          else {
            iVar10 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x2f,0,this_01,0);
            if (iVar10 != 0) {
              local_148 = (int)uVar22;
            }
          }
        }
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0x10;
      } while (uVar22 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
    }
    pQVar12 = QWidget::style(this_01);
    iVar9 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x21,0,this_01);
    if ((this->super_QWidgetPrivate).actions.d.size != 0) {
      local_14c = local_14c + iVar9;
      if (start == -1) {
        start = iVar8;
      }
      iVar9 = iVar9 + iVar7 + start;
      lVar19 = 0;
      uVar22 = 0;
      do {
        pQVar15 = QList<QRect>::data(this_00);
        iVar10 = *(int *)((long)&(pQVar15->x1).m_i + lVar19);
        iVar17 = *(int *)((long)&(pQVar15->y1).m_i + lVar19);
        iVar18 = *(int *)((long)&(pQVar15->x2).m_i + lVar19);
        if ((iVar18 != iVar10 + -1) || (*(int *)((long)&(pQVar15->y2).m_i + lVar19) != iVar17 + -1))
        {
          *(int *)((long)&(pQVar15->y2).m_i + lVar19) = iVar17 + iVar11 + -1;
          iVar17 = iVar9;
          if ((long)local_148 <= (long)uVar22 && local_148 != -1) {
            iVar17 = (max_width + iVar9) - (iVar7 + iVar8 * 2 + iVar2 + iVar16);
            iVar20 = iVar11;
            iVar5 = iVar8;
            iVar21 = iVar8;
            if (iVar16 <= iVar17) {
              iVar20 = 0;
              iVar5 = iVar9;
              iVar21 = iVar16;
            }
            iVar9 = iVar5;
            local_14c = local_14c + iVar20;
            iVar16 = iVar21;
          }
          iVar18 = iVar18 - iVar10;
          *(int *)((long)&(pQVar15->x2).m_i + lVar19) = iVar17 + iVar18;
          *(int *)((long)&(pQVar15->x1).m_i + lVar19) = iVar17;
          piVar1 = (int *)((long)&(pQVar15->y2).m_i + lVar19);
          *piVar1 = *piVar1 + (local_14c - *(int *)((long)&(pQVar15->y1).m_i + lVar19));
          *(int *)((long)&(pQVar15->y1).m_i + lVar19) = local_14c;
          iVar9 = iVar18 + iVar9 + iVar7 + 1;
          direction = QWidget::layoutDirection(this_01);
          pQVar4 = this_01->data;
          puStack_d0 = (undefined1 *)
                       CONCAT44((pQVar4->crect).y2.m_i - (pQVar4->crect).y1.m_i,
                                (pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i);
          local_d8 = (undefined1  [8])0x0;
          QVar23 = QStyle::visualRect(direction,(QRect *)local_d8,
                                      (QRect *)((long)&(pQVar15->x1).m_i + lVar19));
          *(long *)((long)&(pQVar15->x1).m_i + lVar19) = QVar23._0_8_;
          *(long *)((long)&(pQVar15->x2).m_i + lVar19) = QVar23._8_8_;
        }
        uVar22 = uVar22 + 1;
        lVar19 = lVar19 + 0x10;
      } while (uVar22 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_e0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuBarPrivate::calcActionRects(int max_width, int start) const
{
    Q_Q(const QMenuBar);

    if (!itemsDirty)
        return;

    //let's reinitialize the buffer
    actionRects.resize(actions.size());
    actionRects.fill(QRect());

    const QStyle *style = q->style();

    const int itemSpacing = style->pixelMetric(QStyle::PM_MenuBarItemSpacing, nullptr, q);
    int max_item_height = 0, separator = -1, separator_start = 0, separator_len = 0;

    //calculate size
    const QFontMetrics fm = q->fontMetrics();
    const int hmargin = style->pixelMetric(QStyle::PM_MenuBarHMargin, nullptr, q),
              vmargin = style->pixelMetric(QStyle::PM_MenuBarVMargin, nullptr, q),
                icone = style->pixelMetric(QStyle::PM_SmallIconSize, nullptr, q);
    for(int i = 0; i < actions.size(); i++) {
        QAction *action = actions.at(i);
        if (!action->isVisible())
            continue;

        QSize sz;

        //calc what I think the size is..
        if (action->isSeparator()) {
            if (style->styleHint(QStyle::SH_DrawMenuBarSeparator, nullptr, q))
                separator = i;
            continue; //we don't really position these!
        } else {
            const QString s = action->text();
            QIcon is = action->icon();
            // If an icon is set, only the icon is visible
            if (!is.isNull())
                sz = sz.expandedTo(QSize(icone, icone));
            else if (!s.isEmpty())
                sz = fm.size(Qt::TextShowMnemonic, s);
        }

        //let the style modify the above size..
        QStyleOptionMenuItem opt;
        q->initStyleOption(&opt, action);
        sz = q->style()->sizeFromContents(QStyle::CT_MenuBarItem, &opt, sz, q);

        if (!sz.isEmpty()) {
            { //update the separator state
                int iWidth = sz.width() + itemSpacing;
                if (separator == -1)
                    separator_start += iWidth;
                else
                    separator_len += iWidth;
            }
            //maximum height
            max_item_height = qMax(max_item_height, sz.height());
            //append
            actionRects[i] = QRect(0, 0, sz.width(), sz.height());
        }
    }

    //calculate position
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuBarPanelWidth, nullptr, q);
    int x = fw + ((start == -1) ? hmargin : start) + itemSpacing;
    int y = fw + vmargin;
    for(int i = 0; i < actions.size(); i++) {
        QRect &rect = actionRects[i];
        if (rect.isNull())
            continue;

        //resize
        rect.setHeight(max_item_height);

        //move
        if (separator != -1 && i >= separator) { //after the separator
            int left = (max_width - separator_len - hmargin - itemSpacing) + (x - separator_start - hmargin);
            if (left < separator_start) { //wrap
                separator_start = x = hmargin;
                y += max_item_height;
            }
            rect.moveLeft(left);
        } else {
            rect.moveLeft(x);
        }
        rect.moveTop(y);

        //keep moving along..
        x += rect.width() + itemSpacing;

        //make sure we follow the layout direction
        rect = QStyle::visualRect(q->layoutDirection(), q->rect(), rect);
    }
}